

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased
               (int field_number,string *value,CodedOutputStream *output)

{
  string *psVar1;
  uint32_t value_00;
  int size;
  unsigned_long t;
  LogMessage *pLVar2;
  void *data;
  undefined1 auVar3 [16];
  LogMessageFatal local_50 [23];
  Voidify local_39;
  unsigned_long local_38;
  unsigned_long local_30;
  string *local_28;
  string *absl_log_internal_check_op_result;
  CodedOutputStream *output_local;
  string *value_local;
  int field_number_local;
  
  absl_log_internal_check_op_result = (string *)output;
  output_local = (CodedOutputStream *)value;
  value_local._4_4_ = field_number;
  WriteTag(field_number,WIRETYPE_LENGTH_DELIMITED,output);
  t = std::__cxx11::string::size();
  local_30 = absl::lts_20240722::log_internal::GetReferenceableValue(t);
  local_38 = absl::lts_20240722::log_internal::GetReferenceableValue(0x7fffffff);
  local_28 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_30,&local_38,"value.size() <= kInt32MaxSize");
  psVar1 = absl_log_internal_check_op_result;
  if (local_28 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/wire_format_lite.cc"
               ,0x1f6,auVar3._0_8_,auVar3._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
  }
  value_00 = std::__cxx11::string::size();
  io::CodedOutputStream::WriteVarint32((CodedOutputStream *)psVar1,value_00);
  psVar1 = absl_log_internal_check_op_result;
  data = (void *)std::__cxx11::string::data();
  size = std::__cxx11::string::size();
  io::CodedOutputStream::WriteRawMaybeAliased((CodedOutputStream *)psVar1,data,size);
  return;
}

Assistant:

void WireFormatLite::WriteBytesMaybeAliased(int field_number,
                                            const std::string& value,
                                            io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  ABSL_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteRawMaybeAliased(value.data(), value.size());
}